

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O1

void __thiscall
lunasvg::Canvas::drawImage
          (Canvas *this,Bitmap *image,Rect *dstRect,Rect *srcRect,Transform *transform)

{
  plutovg_matrix_t matrix;
  plutovg_matrix_t local_40;
  
  local_40.a = dstRect->w / srcRect->w;
  local_40.d = dstRect->h / srcRect->h;
  local_40.b = 0.0;
  local_40.c = 0.0;
  local_40.e = -srcRect->x * local_40.a;
  local_40.f = -srcRect->y * local_40.d;
  plutovg_canvas_reset_matrix(this->m_canvas);
  plutovg_canvas_translate(this->m_canvas,(float)-this->m_x,(float)-this->m_y);
  plutovg_canvas_transform(this->m_canvas,&transform->m_matrix);
  plutovg_canvas_translate(this->m_canvas,dstRect->x,dstRect->y);
  plutovg_canvas_set_fill_rule(this->m_canvas,PLUTOVG_FILL_RULE_NON_ZERO);
  plutovg_canvas_set_operator(this->m_canvas,PLUTOVG_OPERATOR_SRC_OVER);
  plutovg_canvas_set_texture
            (this->m_canvas,image->m_surface,PLUTOVG_TEXTURE_TYPE_PLAIN,1.0,&local_40);
  plutovg_canvas_fill_rect(this->m_canvas,0.0,0.0,dstRect->w,dstRect->h);
  return;
}

Assistant:

void Canvas::drawImage(const Bitmap& image, const Rect& dstRect, const Rect& srcRect, const Transform& transform)
{
    auto xScale = dstRect.w / srcRect.w;
    auto yScale = dstRect.h / srcRect.h;
    plutovg_matrix_t matrix = { xScale, 0, 0, yScale, -srcRect.x * xScale, -srcRect.y * yScale };
    plutovg_canvas_reset_matrix(m_canvas);
    plutovg_canvas_translate(m_canvas, -m_x, -m_y);
    plutovg_canvas_transform(m_canvas, &transform.matrix());
    plutovg_canvas_translate(m_canvas, dstRect.x, dstRect.y);
    plutovg_canvas_set_fill_rule(m_canvas, PLUTOVG_FILL_RULE_NON_ZERO);
    plutovg_canvas_set_operator(m_canvas, PLUTOVG_OPERATOR_SRC_OVER);
    plutovg_canvas_set_texture(m_canvas, image.surface(), PLUTOVG_TEXTURE_TYPE_PLAIN, 1.f, &matrix);
    plutovg_canvas_fill_rect(m_canvas, 0, 0, dstRect.w, dstRect.h);
}